

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfoMB * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  PrimRefMB *pPVar2;
  BBox1f BVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  char *pcVar5;
  PrimRefMB *pPVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  undefined4 uVar13;
  CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
  *pCVar14;
  uint uVar15;
  size_t *psVar16;
  long lVar17;
  long lVar18;
  size_t sVar19;
  ulong uVar20;
  bool bVar21;
  float fVar22;
  undefined1 auVar23 [12];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar29;
  undefined1 auVar30 [12];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar33;
  float fVar34;
  undefined1 auVar35 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar36;
  float fVar37;
  undefined1 auVar38 [16];
  float fVar40;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar39;
  float fVar41;
  undefined1 auVar42 [12];
  undefined1 auVar43 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar44;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  float local_228;
  float local_224;
  ulong local_1f0;
  unsigned_long local_1d8;
  size_t local_1d0;
  size_t local_1b0;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_188;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_178;
  BBox1f local_168;
  ulong local_110;
  anon_class_16_2_07cfa4d6 local_108;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_f8;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_178 = _DAT_01feb9f0;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = _DAT_01feb9f0;
  local_188 = _DAT_01feba00;
  local_198._0_4_ = (undefined4)DAT_01feba00;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
   (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper
   .field_0.m128 = _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = local_178;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
   (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper
   .field_0.m128 = local_188;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_178;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
   (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
   .m128 = local_188;
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  (__return_storage_ptr__->max_time_range).lower = 0.0;
  __return_storage_ptr__->num_time_segments = 0;
  __return_storage_ptr__->max_num_time_segments = 0;
  *(undefined1 **)&(__return_storage_ptr__->max_time_range).upper = &DAT_3f8000003f800000;
  (__return_storage_ptr__->time_range).upper = 0.0;
  uVar20 = r->_begin;
  local_228 = (__return_storage_ptr__->time_range).lower;
  local_224 = 0.0;
  local_1d0 = __return_storage_ptr__->num_time_segments;
  local_1f0 = __return_storage_ptr__->max_num_time_segments;
  local_168 = __return_storage_ptr__->max_time_range;
  local_198._4_4_ = local_188.m128[1];
  fStack_190 = local_188.m128[2];
  fStack_18c = local_188.m128[3];
  aVar36 = local_178;
  aVar39 = local_188;
  aVar45 = local_178;
  if (uVar20 < r->_end) {
    local_1d8 = (__return_storage_ptr__->object_range)._end;
    _local_198 = local_188.m128;
    local_1b0 = k;
    do {
      BVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
              super_Geometry.time_range;
      fVar41 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               super_Geometry.fnumTimeSegments;
      auVar23._0_4_ = t0t1->lower;
      auVar23._4_4_ = t0t1->upper;
      auVar23._8_4_ = BVar3.lower;
      fVar34 = BVar3.upper - auVar23._8_4_;
      fVar22 = floorf(((auVar23._0_4_ - auVar23._8_4_) / fVar34) * 1.0000002 * fVar41);
      auVar23._8_4_ = ceilf(((auVar23._4_4_ - auVar23._8_4_) / fVar34) * 0.99999976 * fVar41);
      uVar10 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                   super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                  super_CurveGeometry.field_0x68 * uVar20);
      pBVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               vertices.items;
      if ((ulong)(uVar10 + 3) < (pBVar4->super_RawBufferView).num) {
        fVar34 = 0.0;
        if (0.0 <= fVar22) {
          fVar34 = fVar22;
        }
        uVar8 = (uint)fVar34;
        if (fVar41 <= auVar23._8_4_) {
          auVar23._8_4_ = fVar41;
        }
        uVar15 = (uint)auVar23._8_4_;
        bVar21 = uVar15 < uVar8;
        if (uVar8 <= uVar15) {
          uVar9 = (ulong)(int)uVar8;
          psVar16 = &pBVar4[uVar9].super_RawBufferView.stride;
          pCVar14 = this;
          do {
            pcVar5 = ((RawBufferView *)(psVar16 + -2))->ptr_ofs;
            sVar19 = *psVar16;
            lVar17 = sVar19 * (uVar10 + 1);
            lVar18 = sVar19 * (uVar10 + 2);
            lVar11 = sVar19 * (uVar10 + 3);
            auVar28._4_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar5 + lVar17 + 0xc)));
            auVar28._0_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar5 + sVar19 * uVar10 + 0xc)));
            auVar28._8_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar5 + lVar18 + 0xc)));
            auVar28._12_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar5 + lVar11 + 0xc)));
            iVar12 = movmskps((int)pCVar14,auVar28);
            if (iVar12 != 0) {
LAB_00aad728:
              if (!bVar21) goto LAB_00aadc87;
              break;
            }
            pfVar1 = (float *)(pcVar5 + sVar19 * uVar10);
            auVar32._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
            auVar32._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
            auVar32._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
            auVar32._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
            uVar13 = movmskps(0,auVar32);
            if ((~(byte)uVar13 & 7) != 0) goto LAB_00aad728;
            pfVar1 = (float *)(pcVar5 + lVar17);
            auVar24._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
            auVar24._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
            auVar24._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
            auVar24._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
            uVar13 = movmskps(CONCAT31((int3)((uint)uVar13 >> 8),~(byte)uVar13),auVar24);
            if ((~(byte)uVar13 & 7) != 0) goto LAB_00aad728;
            pfVar1 = (float *)(pcVar5 + lVar18);
            auVar25._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
            auVar25._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
            auVar25._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
            auVar25._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
            uVar13 = movmskps(CONCAT31((int3)((uint)uVar13 >> 8),~(byte)uVar13),auVar25);
            pCVar14 = (CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
                       *)(ulong)CONCAT31((int3)((uint)uVar13 >> 8),~(byte)uVar13);
            if ((~(byte)uVar13 & 7) != 0) goto LAB_00aad728;
            pfVar1 = (float *)(pcVar5 + lVar11);
            auVar26._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
            auVar26._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
            auVar26._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
            auVar26._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
            uVar13 = movmskps((int)pcVar5,auVar26);
            if ((~(byte)uVar13 & 7) != 0) goto LAB_00aad728;
            uVar9 = uVar9 + 1;
            psVar16 = psVar16 + 7;
            bVar21 = (ulong)(long)(int)uVar15 < uVar9;
          } while (uVar9 <= (ulong)(long)(int)uVar15);
        }
        local_108.primID = &local_110;
        auVar23._8_4_ =
             (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             super_Geometry.time_range.lower;
        fVar22 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 super_Geometry.time_range.upper - auVar23._8_4_;
        fVar34 = (auVar23._0_4_ - auVar23._8_4_) / fVar22;
        fVar22 = (auVar23._4_4_ - auVar23._8_4_) / fVar22;
        auVar23._8_4_ = fVar41 * fVar22;
        local_110 = uVar20;
        local_108.this = this;
        auVar23._0_4_ = floorf(fVar41 * fVar34);
        auVar23._4_4_ = ceilf(auVar23._8_4_);
        uVar10 = (uint)auVar23._0_4_;
        if (auVar23._0_4_ <= 0.0) {
          auVar23._0_4_ = 0.0;
        }
        fVar50 = auVar23._4_4_;
        if (fVar41 <= auVar23._4_4_) {
          fVar50 = fVar41;
        }
        if ((int)uVar10 < 0) {
          uVar10 = 0xffffffff;
        }
        iVar12 = (int)fVar41 + 1;
        if ((int)auVar23._4_4_ < (int)fVar41 + 1) {
          iVar12 = (int)auVar23._4_4_;
        }
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_d8.field_1,&local_108,(long)(int)auVar23._0_4_);
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_f8.field_1,&local_108,(long)(int)fVar50);
        auVar23._4_4_ = fVar41 * fVar34 - auVar23._0_4_;
        if (iVar12 - uVar10 == 1) {
          if (auVar23._4_4_ <= 0.0) {
            auVar23._4_4_ = 0.0;
          }
          fVar41 = 1.0 - auVar23._4_4_;
          fVar46 = fVar41 * local_d8.m128[0] + auVar23._4_4_ * local_f8.m128[0];
          fVar47 = fVar41 * local_d8.m128[1] + auVar23._4_4_ * local_f8.m128[1];
          fVar48 = fVar41 * local_d8.m128[2] + auVar23._4_4_ * local_f8.m128[2];
          auVar42._0_4_ = fVar41 * local_c8 + auVar23._4_4_ * local_e8;
          auVar42._4_4_ = fVar41 * fStack_c4 + auVar23._4_4_ * fStack_e4;
          auVar42._8_4_ = fVar41 * fStack_c0 + auVar23._4_4_ * fStack_e0;
          fVar50 = fVar50 - auVar23._8_4_;
          if (fVar50 <= 0.0) {
            fVar50 = 0.0;
          }
          fVar41 = 1.0 - fVar50;
          auVar23._0_4_ = local_f8.m128[0] * fVar41 + local_d8.m128[0] * fVar50;
          auVar23._4_4_ = local_f8.m128[1] * fVar41 + local_d8.m128[1] * fVar50;
          auVar23._8_4_ = local_f8.m128[2] * fVar41 + local_d8.m128[2] * fVar50;
          auVar30._0_4_ = fVar41 * local_e8 + fVar50 * local_c8;
          auVar30._4_4_ = fVar41 * fStack_e4 + fVar50 * fStack_c4;
          auVar30._8_4_ = fVar41 * fStack_e0 + fVar50 * fStack_c0;
        }
        else {
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_58.field_1,&local_108,(long)((int)auVar23._0_4_ + 1));
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_78.field_1,&local_108,(long)((int)fVar50 + -1));
          if (auVar23._4_4_ <= 0.0) {
            auVar23._4_4_ = 0.0;
          }
          auVar23._0_4_ = 1.0 - auVar23._4_4_;
          fVar46 = local_d8.m128[0] * auVar23._0_4_ + local_58.m128[0] * auVar23._4_4_;
          fVar47 = local_d8.m128[1] * auVar23._0_4_ + local_58.m128[1] * auVar23._4_4_;
          fVar48 = local_d8.m128[2] * auVar23._0_4_ + local_58.m128[2] * auVar23._4_4_;
          fVar49 = local_d8.m128[3] * auVar23._0_4_ + local_58.m128[3] * auVar23._4_4_;
          auVar42._0_4_ = auVar23._0_4_ * local_c8 + auVar23._4_4_ * local_48;
          auVar42._4_4_ = auVar23._0_4_ * fStack_c4 + auVar23._4_4_ * fStack_44;
          auVar42._8_4_ = auVar23._0_4_ * fStack_c0 + auVar23._4_4_ * fStack_40;
          auVar43._12_4_ = auVar23._0_4_ * fStack_bc + auVar23._4_4_ * fStack_3c;
          auVar43._0_12_ = auVar42;
          fVar50 = fVar50 - auVar23._8_4_;
          if (fVar50 <= 0.0) {
            fVar50 = 0.0;
          }
          fVar37 = 1.0 - fVar50;
          auVar23._0_4_ = local_f8.m128[0] * fVar37 + local_78.m128[0] * fVar50;
          auVar23._4_4_ = local_f8.m128[1] * fVar37 + local_78.m128[1] * fVar50;
          auVar23._8_4_ = local_f8.m128[2] * fVar37 + local_78.m128[2] * fVar50;
          fVar51 = local_f8.m128[3] * fVar37 + local_78.m128[3] * fVar50;
          auVar38._0_8_ =
               CONCAT44(fVar37 * fStack_e4 + fVar50 * fStack_64,
                        fVar37 * local_e8 + fVar50 * local_68);
          auVar38._8_4_ = fVar37 * fStack_e0 + fVar50 * fStack_60;
          auVar38._12_4_ = fVar37 * fStack_dc + fVar50 * fStack_5c;
          if ((int)(uVar10 + 1) < iVar12) {
            sVar19 = (size_t)(uVar10 + 1);
            iVar12 = ~uVar10 + iVar12;
            do {
              fVar50 = ((float)(int)sVar19 / fVar41 - fVar34) / (fVar22 - fVar34);
              fVar37 = 1.0 - fVar50;
              fVar40 = auVar38._12_4_;
              local_a8 = fVar37 * auVar43._0_4_ + fVar50 * auVar38._0_4_;
              fStack_a4 = fVar37 * auVar43._4_4_ + fVar50 * auVar38._4_4_;
              fStack_a0 = fVar37 * auVar43._8_4_ + fVar50 * auVar38._8_4_;
              fStack_9c = fVar37 * auVar43._12_4_ + fVar50 * fVar40;
              local_b8 = auVar23._0_4_;
              fStack_b4 = auVar23._4_4_;
              fStack_b0 = auVar23._8_4_;
              fStack_ac = fVar51;
              linearBounds::anon_class_16_2_07cfa4d6::operator()
                        ((BBox3fa *)&local_98.field_1,&local_108,sVar19);
              auVar27._0_4_ = local_98.m128[0] - (fVar46 * fVar37 + auVar23._0_4_ * fVar50);
              auVar27._4_4_ = local_98.m128[1] - (fVar47 * fVar37 + auVar23._4_4_ * fVar50);
              auVar27._8_4_ = local_98.m128[2] - (fVar48 * fVar37 + auVar23._8_4_ * fVar50);
              auVar27._12_4_ = local_98.m128[3] - (fVar49 * fVar37 + fVar51 * fVar50);
              auVar31._0_4_ = local_88 - local_a8;
              auVar31._4_4_ = fStack_84 - fStack_a4;
              auVar31._8_4_ = fStack_80 - fStack_a0;
              auVar31._12_4_ = fStack_7c - fStack_9c;
              auVar28 = minps(auVar27,ZEXT816(0));
              auVar32 = maxps(auVar31,ZEXT816(0));
              fVar46 = fVar46 + auVar28._0_4_;
              fVar47 = fVar47 + auVar28._4_4_;
              fVar48 = fVar48 + auVar28._8_4_;
              fVar49 = fVar49 + auVar28._12_4_;
              auVar23._0_4_ = auVar28._0_4_ + local_b8;
              auVar23._4_4_ = auVar28._4_4_ + fStack_b4;
              auVar23._8_4_ = auVar28._8_4_ + fStack_b0;
              fVar51 = auVar28._12_4_ + fStack_ac;
              auVar42._0_4_ = auVar43._0_4_ + auVar32._0_4_;
              auVar42._4_4_ = auVar43._4_4_ + auVar32._4_4_;
              auVar42._8_4_ = auVar43._8_4_ + auVar32._8_4_;
              auVar43._12_4_ = auVar43._12_4_ + auVar32._12_4_;
              auVar43._0_12_ = auVar42;
              auVar30._0_8_ = CONCAT44(auVar32._4_4_ + auVar38._4_4_,auVar32._0_4_ + auVar38._0_4_);
              auVar30._8_4_ = auVar32._8_4_ + auVar38._8_4_;
              sVar19 = sVar19 + 1;
              auVar38._8_4_ = auVar30._8_4_;
              auVar38._0_8_ = auVar30._0_8_;
              auVar38._12_4_ = auVar32._12_4_ + fVar40;
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
          }
          else {
            auVar30._8_4_ = auVar38._8_4_;
            auVar30._0_8_ = auVar38._0_8_;
          }
        }
        fVar41 = (float)((this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                         super_CurveGeometry.super_Geometry.numTimeSteps - 1);
        uVar9 = (ulong)(uint)fVar41;
        aVar44.m128[3] = (float)uVar20;
        aVar44._0_12_ = auVar42;
        aVar29.m128[3] = fVar41;
        aVar29._0_12_ = auVar23;
        aVar33.m128[3] = fVar41;
        aVar33._0_12_ = auVar30;
        auVar35._0_4_ =
             auVar42._0_4_ * 0.5 + auVar30._0_4_ * 0.5 + fVar46 * 0.5 + auVar23._0_4_ * 0.5;
        auVar35._4_4_ =
             auVar42._4_4_ * 0.5 + auVar30._4_4_ * 0.5 + fVar47 * 0.5 + auVar23._4_4_ * 0.5;
        auVar35._8_4_ =
             auVar42._8_4_ * 0.5 + auVar30._8_4_ * 0.5 + fVar48 * 0.5 + auVar23._8_4_ * 0.5;
        auVar35._12_4_ = (float)uVar20 * 0.5 + fVar41 * 0.5 + (float)geomID * 0.5 + fVar41 * 0.5;
        BVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                super_Geometry.time_range;
        fVar41 = BVar3.lower;
        auVar23._0_4_ = BVar3.upper;
        auVar7._4_4_ = fVar47;
        auVar7._0_4_ = fVar46;
        auVar7._8_4_ = fVar48;
        auVar7._12_4_ = geomID;
        local_178.m128 = (__m128)minps(local_178.m128,auVar7);
        local_1d8 = local_1d8 + 1;
        local_1d0 = local_1d0 + uVar9;
        bVar21 = local_1f0 < uVar9;
        if (local_1f0 <= uVar9) {
          local_1f0 = uVar9;
        }
        pPVar6 = prims->items;
        pPVar2 = pPVar6 + local_1b0;
        (pPVar2->lbounds).bounds0.lower.field_0.m128[0] = fVar46;
        (pPVar2->lbounds).bounds0.lower.field_0.m128[1] = fVar47;
        (pPVar2->lbounds).bounds0.lower.field_0.m128[2] = fVar48;
        (pPVar2->lbounds).bounds0.lower.field_0.m128[3] = (float)geomID;
        local_188.m128 = (__m128)maxps(local_188.m128,aVar44.m128);
        pPVar6[local_1b0].lbounds.bounds0.upper.field_0 = aVar44;
        aVar45.m128 = (__m128)minps(aVar45.m128,aVar29.m128);
        pPVar6[local_1b0].lbounds.bounds1.lower.field_0 = aVar29;
        aVar39.m128 = (__m128)maxps(aVar39.m128,aVar33.m128);
        pPVar6[local_1b0].lbounds.bounds1.upper.field_0 = aVar33;
        pPVar6[local_1b0].time_range = BVar3;
        aVar36.m128 = (__m128)minps(aVar36.m128,auVar35);
        _local_198 = (__m128)maxps(_local_198,auVar35);
        if (fVar41 <= local_228) {
          local_228 = fVar41;
        }
        auVar23._4_4_ = auVar23._0_4_;
        if (auVar23._0_4_ <= local_224) {
          auVar23._4_4_ = local_224;
        }
        uVar10 = (int)((uint)bVar21 << 0x1f) >> 0x1f;
        uVar8 = (int)((uint)bVar21 << 0x1f) >> 0x1f;
        local_1b0 = local_1b0 + 1;
        local_168.upper = (float)(~uVar8 & (uint)local_168.upper | (uint)auVar23._0_4_ & uVar8);
        local_168.lower = (float)(~uVar10 & (uint)local_168.lower | (uint)fVar41 & uVar10);
        local_224 = auVar23._4_4_;
      }
LAB_00aadc87:
      uVar20 = uVar20 + 1;
    } while (uVar20 < r->_end);
    (__return_storage_ptr__->object_range)._end = local_1d8;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = local_178;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = local_188;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar45;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar39;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar36;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = (float)local_198._0_4_;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = (float)local_198._4_4_;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = fStack_190;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = fStack_18c;
  (__return_storage_ptr__->time_range).lower = local_228;
  (__return_storage_ptr__->time_range).upper = local_224;
  __return_storage_ptr__->num_time_segments = local_1d0;
  __return_storage_ptr__->max_num_time_segments = local_1f0;
  __return_storage_ptr__->max_time_range = local_168;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }